

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeConcatLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  mapped_type *pmVar6;
  mapped_type *this_00;
  ConcatLayerParams *pCVar7;
  ShapeRange *pSVar8;
  ShapeRange local_98;
  ShapeRange local_78;
  mapped_type *local_58;
  ShapeConstraint *inputShapei;
  undefined1 auStack_48 [4];
  int i;
  ShapeRange outShape;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar5 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,(key_type *)psVar5);
  psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,(key_type *)psVar5);
  outShape._maximum._val = (size_t)this_00;
  psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_00,psVar5);
  ShapeRange::ShapeRange((ShapeRange *)auStack_48);
  pCVar7 = Specification::NeuralNetworkLayer::concat(specLayer);
  bVar3 = Specification::ConcatLayerParams::sequenceconcat(pCVar7);
  if (bVar3) {
    pSVar8 = ShapeConstraint::sequenceRange(pmVar6);
    sVar2 = outShape._maximum._val;
    auStack_48[0] = (pSVar8->_minimum)._isUnbound;
    unique0x00012001 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
    outShape._minimum._0_8_ = (pSVar8->_minimum)._val;
    outShape._minimum._val = *(size_t *)&pSVar8->_maximum;
    outShape._maximum._0_8_ = (pSVar8->_maximum)._val;
    pSVar8 = ShapeConstraint::channelRange(pmVar6);
    ShapeConstraint::updateChannelRange((ShapeConstraint *)sVar2,pSVar8);
  }
  else {
    pSVar8 = ShapeConstraint::channelRange(pmVar6);
    sVar2 = outShape._maximum._val;
    auStack_48[0] = (pSVar8->_minimum)._isUnbound;
    unique0x00012001 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
    outShape._minimum._0_8_ = (pSVar8->_minimum)._val;
    outShape._minimum._val = *(size_t *)&pSVar8->_maximum;
    outShape._maximum._0_8_ = (pSVar8->_maximum)._val;
    pSVar8 = ShapeConstraint::sequenceRange(pmVar6);
    ShapeConstraint::updateSequenceRange((ShapeConstraint *)sVar2,pSVar8);
  }
  sVar2 = outShape._maximum._val;
  pSVar8 = ShapeConstraint::batchRange(pmVar6);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)sVar2,pSVar8);
  sVar2 = outShape._maximum._val;
  pSVar8 = ShapeConstraint::heightRange(pmVar6);
  ShapeConstraint::updateHeightRange((ShapeConstraint *)sVar2,pSVar8);
  sVar2 = outShape._maximum._val;
  pSVar8 = ShapeConstraint::widthRange(pmVar6);
  ShapeConstraint::updateWidthRange((ShapeConstraint *)sVar2,pSVar8);
  inputShapei._4_4_ = 1;
  while( true ) {
    iVar1 = inputShapei._4_4_;
    iVar4 = Specification::NeuralNetworkLayer::input_size(specLayer);
    if (iVar4 <= iVar1) break;
    psVar5 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,inputShapei._4_4_);
    local_58 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](&this->blobShapes,(key_type *)psVar5);
    pCVar7 = Specification::NeuralNetworkLayer::concat(specLayer);
    bVar3 = Specification::ConcatLayerParams::sequenceconcat(pCVar7);
    if (bVar3) {
      pSVar8 = ShapeConstraint::sequenceRange(local_58);
      ShapeRange::operator+(&local_78,(ShapeRange *)auStack_48,pSVar8);
      sVar2 = outShape._maximum._val;
      auStack_48[0] = local_78._minimum._isUnbound;
      stack0xffffffffffffffb9 = local_78._minimum._1_7_;
      outShape._minimum._0_8_ = local_78._minimum._val;
      outShape._minimum._val = local_78._maximum._0_8_;
      outShape._maximum._0_8_ = local_78._maximum._val;
      pSVar8 = ShapeConstraint::channelRange(local_58);
      ShapeConstraint::updateChannelRange((ShapeConstraint *)sVar2,pSVar8);
      pmVar6 = local_58;
      pSVar8 = ShapeConstraint::channelRange((ShapeConstraint *)outShape._maximum._val);
      ShapeConstraint::updateChannelRange(pmVar6,pSVar8);
    }
    else {
      pSVar8 = ShapeConstraint::channelRange(local_58);
      ShapeRange::operator+(&local_98,(ShapeRange *)auStack_48,pSVar8);
      sVar2 = outShape._maximum._val;
      auStack_48[0] = local_98._minimum._isUnbound;
      stack0xffffffffffffffb9 = local_98._minimum._1_7_;
      outShape._minimum._0_8_ = local_98._minimum._val;
      outShape._minimum._val = local_98._maximum._0_8_;
      outShape._maximum._0_8_ = local_98._maximum._val;
      pSVar8 = ShapeConstraint::sequenceRange(local_58);
      ShapeConstraint::updateSequenceRange((ShapeConstraint *)sVar2,pSVar8);
      pmVar6 = local_58;
      pSVar8 = ShapeConstraint::sequenceRange((ShapeConstraint *)outShape._maximum._val);
      ShapeConstraint::updateSequenceRange(pmVar6,pSVar8);
    }
    sVar2 = outShape._maximum._val;
    pSVar8 = ShapeConstraint::batchRange(local_58);
    ShapeConstraint::updateBatchRange((ShapeConstraint *)sVar2,pSVar8);
    pmVar6 = local_58;
    pSVar8 = ShapeConstraint::batchRange((ShapeConstraint *)outShape._maximum._val);
    ShapeConstraint::updateBatchRange(pmVar6,pSVar8);
    sVar2 = outShape._maximum._val;
    pSVar8 = ShapeConstraint::heightRange(local_58);
    ShapeConstraint::updateHeightRange((ShapeConstraint *)sVar2,pSVar8);
    pmVar6 = local_58;
    pSVar8 = ShapeConstraint::heightRange((ShapeConstraint *)outShape._maximum._val);
    ShapeConstraint::updateHeightRange(pmVar6,pSVar8);
    sVar2 = outShape._maximum._val;
    pSVar8 = ShapeConstraint::widthRange(local_58);
    ShapeConstraint::updateWidthRange((ShapeConstraint *)sVar2,pSVar8);
    pmVar6 = local_58;
    pSVar8 = ShapeConstraint::widthRange((ShapeConstraint *)outShape._maximum._val);
    ShapeConstraint::updateWidthRange(pmVar6,pSVar8);
    inputShapei._4_4_ = inputShapei._4_4_ + 1;
  }
  pCVar7 = Specification::NeuralNetworkLayer::concat(specLayer);
  bVar3 = Specification::ConcatLayerParams::sequenceconcat(pCVar7);
  if (bVar3) {
    ShapeConstraint::updateSequenceRange
              ((ShapeConstraint *)outShape._maximum._val,(ShapeRange *)auStack_48);
  }
  else {
    ShapeConstraint::updateChannelRange
              ((ShapeConstraint *)outShape._maximum._val,(ShapeRange *)auStack_48);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeConcatLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Concat layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Concat layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    ShapeRange outShape;
    if (specLayer.concat().sequenceconcat()) {
        outShape = inputShape.sequenceRange();
        outputShape.updateChannelRange(inputShape.channelRange());
    }
    else {
        outShape = inputShape.channelRange();
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    outputShape.updateBatchRange(inputShape.batchRange());
    outputShape.updateHeightRange(inputShape.heightRange());
    outputShape.updateWidthRange(inputShape.widthRange());

    for (int i = 1; i < specLayer.input_size(); i++) {
        ShapeConstraint& inputShapei = blobShapes[specLayer.input(i)];
        if (specLayer.concat().sequenceconcat()) {
            outShape = outShape + inputShapei.sequenceRange();
            outputShape.updateChannelRange(inputShapei.channelRange());
            inputShapei.updateChannelRange(outputShape.channelRange());
        }
        else {
            outShape = outShape + inputShapei.channelRange();
            outputShape.updateSequenceRange(inputShapei.sequenceRange());
            inputShapei.updateSequenceRange(outputShape.sequenceRange());
        }
        outputShape.updateBatchRange(inputShapei.batchRange());
        inputShapei.updateBatchRange(outputShape.batchRange());

        outputShape.updateHeightRange(inputShapei.heightRange());
        inputShapei.updateHeightRange(outputShape.heightRange());

        outputShape.updateWidthRange(inputShapei.widthRange());
        inputShapei.updateWidthRange(outputShape.widthRange());

    }

    if (specLayer.concat().sequenceconcat()) {
        outputShape.updateSequenceRange(outShape);
    }
    else {
        outputShape.updateChannelRange(outShape);
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Concat layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Concat layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}